

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

bool __thiscall Kernel::Clause::computable(Clause *this)

{
  bool bVar1;
  uint uVar2;
  Literal **ppLVar3;
  Clause *in_RDI;
  uint i;
  uint local_14;
  Clause *this_00;
  
  local_14 = 0;
  this_00 = in_RDI;
  do {
    uVar2 = length(in_RDI);
    if (uVar2 <= local_14) {
      return true;
    }
    operator[](in_RDI,local_14);
    bVar1 = Literal::isAnswerLiteral((Literal *)this_00);
    if (!bVar1) {
      ppLVar3 = operator[](in_RDI,local_14);
      uVar2 = (**((*ppLVar3)->super_Term)._vptr_Term)();
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool Clause::computable() {
  for (unsigned i = 0; i < length(); ++i) {
    if ((*this)[i]->isAnswerLiteral()) {
      continue;
    }
    if (!(*this)[i]->computable()) {
      return false;
    }
  }
  return true;
}